

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

void __thiscall soul::heart::Parser::parseStructBody(Parser *this,Structure *s)

{
  StructurePtr o;
  bool bVar1;
  SourceCodeText *o_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string_view memberName;
  Type type;
  string name;
  CodeLocation typeLocation;
  Type structType;
  Type local_170;
  string local_158;
  CodeLocation local_138;
  string local_128;
  Type local_108;
  Type local_f0;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x258ac2);
  if (!bVar1) {
    do {
      o_00 = (this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).location.sourceCode.object;
      if (o_00 != (SourceCodeText *)0x0) {
        (o_00->super_RefCountedObject).refCount = (o_00->super_RefCountedObject).refCount + 1;
      }
      local_138.location.data =
           (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.location.data;
      local_138.sourceCode.object = o_00;
      readValueType(&local_170,this);
      readGeneralIdentifier_abi_cxx11_(&local_158,this);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x2585e7);
      memberName._M_str = local_158._M_dataplus._M_p;
      memberName._M_len = local_158._M_string_length;
      bVar1 = Structure::hasMemberWithName(s,memberName);
      if (bVar1) {
        CompileMessageHelpers::createMessage<std::__cxx11::string&>
                  (&local_d8,(CompileMessageHelpers *)0x1,none,0x27b770,(char *)&local_158,in_R9);
        (*(this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser[2])(this,&local_d8);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_d8.location.sourceCode.object);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_d8.description._M_dataplus._M_p._1_7_,
                        local_d8.description._M_dataplus._M_p._0_1_) !=
            &local_d8.description.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_d8.description._M_dataplus._M_p._1_7_,
                                   local_d8.description._M_dataplus._M_p._0_1_),
                          (ulong)(local_d8.description.field_2._M_allocated_capacity + 1));
        }
      }
      local_d8.description._M_dataplus._M_p._0_1_ = 6;
      local_d8.description._M_string_length._1_7_ = 0;
      local_d8.description._M_dataplus._M_p._1_7_ = 0;
      local_d8.description._M_string_length._0_1_ = 0;
      (s->super_RefCountedObject).refCount = (s->super_RefCountedObject).refCount + 1;
      local_d8.description.field_2._M_allocated_capacity = (size_type)s;
      bVar1 = Type::isEqual(&local_170,(Type *)&local_d8,0);
      o.object = local_170.structure.object;
      if (bVar1) {
        CompileMessageHelpers::createMessage<std::__cxx11::string_const&>
                  (&local_68,(CompileMessageHelpers *)0x1,none,0x25984f,(char *)&s->name,in_R9);
        CodeLocation::throwError(&local_138,&local_68);
      }
      if (local_170.category == structure) {
        if (local_170.structure.object == (Structure *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x47);
        }
        ((local_170.structure.object)->super_RefCountedObject).refCount =
             ((local_170.structure.object)->super_RefCountedObject).refCount + 1;
        local_f0.category = structure;
        local_f0._9_7_ = 0;
        local_f0.arrayElementCategory = invalid;
        local_f0.isRef = false;
        local_f0.isConstant = false;
        local_f0.primitiveType.type = invalid;
        local_f0.boundingSize._0_1_ = 0;
        (s->super_RefCountedObject).refCount = (s->super_RefCountedObject).refCount + 1;
        local_f0.structure.object = s;
        bVar1 = Structure::containsMemberOfType(local_170.structure.object,&local_f0,true);
        RefCountedPtr<soul::Structure>::decIfNotNull(s);
        RefCountedPtr<soul::Structure>::decIfNotNull(o.object);
        if (bVar1) {
          if (local_170.category != structure) {
            throwInternalCompilerError("isStruct()","getStruct",0x188);
          }
          if (local_170.structure.object == (Structure *)0x0) {
            throwInternalCompilerError("object != nullptr","operator->",0x47);
          }
          ((local_170.structure.object)->super_RefCountedObject).refCount =
               ((local_170.structure.object)->super_RefCountedObject).refCount + 1;
          CompileMessageHelpers::
          createMessage<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    (&local_a0,(CompileMessageHelpers *)0x1,none,0x259882,(char *)&s->name,
                     &(local_170.structure.object)->name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)o_00);
          CodeLocation::throwError(&local_138,&local_a0);
        }
      }
      local_108.category = local_170.category;
      local_108.arrayElementCategory = local_170.arrayElementCategory;
      local_108.isRef = local_170.isRef;
      local_108.isConstant = local_170.isConstant;
      local_108.primitiveType.type = local_170.primitiveType.type;
      local_108.boundingSize = local_170.boundingSize;
      local_108.arrayElementBoundingSize = local_170.arrayElementBoundingSize;
      local_108.structure.object = local_170.structure.object;
      if (local_170.structure.object != (Structure *)0x0) {
        ((local_170.structure.object)->super_RefCountedObject).refCount =
             ((local_170.structure.object)->super_RefCountedObject).refCount + 1;
      }
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_158._M_dataplus._M_p,
                 local_158._M_dataplus._M_p + local_158._M_string_length);
      Structure::addMember(s,&local_108,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(local_108.structure.object);
      RefCountedPtr<soul::Structure>::decIfNotNull(s);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(local_170.structure.object);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o_00);
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x258ac2);
    } while (!bVar1);
  }
  return;
}

Assistant:

void parseStructBody (Structure& s)
    {
        while (! matchIf (HEARTOperator::closeBrace))
        {
            auto typeLocation = location;

            auto type = readValueType();
            auto name = readGeneralIdentifier();
            expectSemicolon();

            if (s.hasMemberWithName (name))
                throwError (Errors::nameInUse (name));

            auto structType = Type::createStruct (s);

            if (type.isEqual (structType, Type::failOnAllDifferences))
                typeLocation.throwError (Errors::typeContainsItself (s.getName()));

            if (type.isStruct() && type.getStruct()->containsMemberOfType (Type::createStruct (s), true))
                typeLocation.throwError (Errors::typesReferToEachOther (s.getName(), type.getStruct()->getName()));

            s.addMember (type, name);
        }
    }